

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O3

size_t __thiscall
helics::tcp::TcpCommsSS::dataReceive
          (TcpCommsSS *this,TcpConnection *connection,char *data,size_t bytes_received)

{
  size_t sVar1;
  size_t sVar2;
  ActionMessage local_e8;
  
  if (bytes_received == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      local_e8.messageAction = cmd_ignore;
      local_e8.messageID = 0;
      local_e8.source_id.gid = 0;
      local_e8.source_handle.hid = -1700000000;
      local_e8.dest_id.gid = 0;
      local_e8.dest_handle.hid = -1700000000;
      local_e8.payload.buffer._M_elems[0x38] = 0;
      local_e8.payload.buffer._M_elems[0x39] = 0;
      local_e8.payload.buffer._M_elems[0x3a] = 0;
      local_e8.payload.buffer._M_elems[0x3b] = 0;
      local_e8.payload.buffer._M_elems[0x3c] = 0;
      local_e8.payload.buffer._M_elems[0x3d] = 0;
      local_e8.payload.buffer._M_elems[0x3e] = 0;
      local_e8.payload.buffer._M_elems[0x3f] = 0;
      local_e8.payload.bufferSize = 0;
      local_e8.payload.buffer._M_elems[0x28] = 0;
      local_e8.payload.buffer._M_elems[0x29] = 0;
      local_e8.payload.buffer._M_elems[0x2a] = 0;
      local_e8.payload.buffer._M_elems[0x2b] = 0;
      local_e8.payload.buffer._M_elems[0x2c] = 0;
      local_e8.payload.buffer._M_elems[0x2d] = 0;
      local_e8.payload.buffer._M_elems[0x2e] = 0;
      local_e8.payload.buffer._M_elems[0x2f] = 0;
      local_e8.payload.buffer._M_elems[0x30] = 0;
      local_e8.payload.buffer._M_elems[0x31] = 0;
      local_e8.payload.buffer._M_elems[0x32] = 0;
      local_e8.payload.buffer._M_elems[0x33] = 0;
      local_e8.payload.buffer._M_elems[0x34] = 0;
      local_e8.payload.buffer._M_elems[0x35] = 0;
      local_e8.payload.buffer._M_elems[0x36] = 0;
      local_e8.payload.buffer._M_elems[0x37] = 0;
      local_e8.payload.buffer._M_elems[0x18] = 0;
      local_e8.payload.buffer._M_elems[0x19] = 0;
      local_e8.payload.buffer._M_elems[0x1a] = 0;
      local_e8.payload.buffer._M_elems[0x1b] = 0;
      local_e8.payload.buffer._M_elems[0x1c] = 0;
      local_e8.payload.buffer._M_elems[0x1d] = 0;
      local_e8.payload.buffer._M_elems[0x1e] = 0;
      local_e8.payload.buffer._M_elems[0x1f] = 0;
      local_e8.payload.buffer._M_elems[0x20] = 0;
      local_e8.payload.buffer._M_elems[0x21] = 0;
      local_e8.payload.buffer._M_elems[0x22] = 0;
      local_e8.payload.buffer._M_elems[0x23] = 0;
      local_e8.payload.buffer._M_elems[0x24] = 0;
      local_e8.payload.buffer._M_elems[0x25] = 0;
      local_e8.payload.buffer._M_elems[0x26] = 0;
      local_e8.payload.buffer._M_elems[0x27] = 0;
      local_e8.payload.buffer._M_elems[8] = 0;
      local_e8.payload.buffer._M_elems[9] = 0;
      local_e8.payload.buffer._M_elems[10] = 0;
      local_e8.payload.buffer._M_elems[0xb] = 0;
      local_e8.payload.buffer._M_elems[0xc] = 0;
      local_e8.payload.buffer._M_elems[0xd] = 0;
      local_e8.payload.buffer._M_elems[0xe] = 0;
      local_e8.payload.buffer._M_elems[0xf] = 0;
      local_e8.payload.buffer._M_elems[0x10] = 0;
      local_e8.payload.buffer._M_elems[0x11] = 0;
      local_e8.payload.buffer._M_elems[0x12] = 0;
      local_e8.payload.buffer._M_elems[0x13] = 0;
      local_e8.payload.buffer._M_elems[0x14] = 0;
      local_e8.payload.buffer._M_elems[0x15] = 0;
      local_e8.payload.buffer._M_elems[0x16] = 0;
      local_e8.payload.buffer._M_elems[0x17] = 0;
      local_e8.Tso.internalTimeCode = 0;
      local_e8.payload.buffer._M_elems[0] = 0;
      local_e8.payload.buffer._M_elems[1] = 0;
      local_e8.payload.buffer._M_elems[2] = 0;
      local_e8.payload.buffer._M_elems[3] = 0;
      local_e8.payload.buffer._M_elems[4] = 0;
      local_e8.payload.buffer._M_elems[5] = 0;
      local_e8.payload.buffer._M_elems[6] = 0;
      local_e8.payload.buffer._M_elems[7] = 0;
      local_e8.Te.internalTimeCode = 0;
      local_e8.Tdemin.internalTimeCode = 0;
      local_e8.counter = 0;
      local_e8.flags = 0;
      local_e8.sequenceID = 0;
      local_e8.actionTime.internalTimeCode = 0;
      local_e8.payload.bufferCapacity = 0x40;
      local_e8.payload.heap = (byte *)&local_e8.payload;
      local_e8.stringData.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.stringData.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.payload.nonOwning = false;
      local_e8.payload.locked = false;
      local_e8.payload.usingAllocatedBuffer = false;
      local_e8.payload.errorCondition = '\0';
      local_e8.payload.userKey = 0;
      local_e8.stringData.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sVar1 = ActionMessage::depacketize(&local_e8,data + sVar2,bytes_received - sVar2);
      if (sVar1 == 0) {
        ActionMessage::~ActionMessage(&local_e8);
        return sVar2;
      }
      if (((local_e8.messageAction == cmd_protocol_priority) ||
          (local_e8.messageAction == cmd_protocol_big)) || (local_e8.messageAction == cmd_protocol))
      {
        local_e8.dest_handle.hid = connection->idcode;
        gmlc::containers::
        BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
        ::emplace<helics::route_id_const&,helics::ActionMessage>
                  ((BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                    *)&(this->super_NetworkCommsInterface).super_CommsInterface.txQueue,
                   (route_id *)&control_route,&local_e8);
      }
      else if ((this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback.
               super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback._M_invoker)
                  ((_Any_data *)
                   &(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback,
                   &local_e8);
      }
      sVar2 = sVar2 + sVar1;
      ActionMessage::~ActionMessage(&local_e8);
    } while (sVar2 < bytes_received);
  }
  return sVar2;
}

Assistant:

size_t TcpCommsSS::dataReceive(TcpConnection* connection, const char* data, size_t bytes_received)
{
    size_t used_total = 0;
    while (used_total < bytes_received) {
        ActionMessage m;
        auto used = m.depacketize(reinterpret_cast<const std::byte*>(data) + used_total,
                                  bytes_received - used_total);
        if (used == 0) {
            break;
        }
        if (isProtocolCommand(m)) {
            m.setExtraData(connection->getIdentifier());
            txQueue.emplace(control_route, std::move(m));
        } else {
            if (ActionCallback) {
                ActionCallback(std::move(m));
            }
        }
        used_total += used;
    }

    return used_total;
}